

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O2

int __thiscall Timidity::Renderer::allocate_voice(Renderer *this)

{
  uint uVar1;
  Voice *pVVar2;
  ulong uVar3;
  ulong uVar4;
  Voice *pVVar5;
  ulong uVar6;
  float *pfVar7;
  float fVar8;
  
  uVar1 = this->voices;
  pVVar2 = this->voice;
  uVar3 = 0;
  uVar4 = 0;
  pVVar5 = pVVar2;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  while( true ) {
    if (uVar4 == uVar3) {
      uVar3 = 0xffffffffffffffff;
      uVar4 = (long)(int)uVar1;
      fVar8 = 1e+10;
      do {
        pfVar7 = &pVVar2[uVar4 - 1].attenuation;
        uVar6 = 0;
        while( true ) {
          if (uVar6 == uVar4) {
            if ((int)uVar3 < 0) {
              this->lost_notes = this->lost_notes + 1;
              return (int)uVar3;
            }
            this->cut_notes = this->cut_notes + 1;
            pVVar2[uVar3 & 0xffffffff].status = '\0';
            goto LAB_0037093b;
          }
          if (((((Voice *)(pfVar7 + -0x32))->status & 0xc) == 4) && (*pfVar7 < fVar8)) break;
          uVar6 = uVar6 + 1;
          pfVar7 = pfVar7 + -0x5c;
        }
        uVar3 = (ulong)(~(uint)uVar6 + (int)uVar4);
        uVar4 = ~uVar6 + uVar4;
        fVar8 = *pfVar7;
      } while( true );
    }
    if ((pVVar5->status & 1) == 0) break;
    uVar3 = uVar3 + 1;
    pVVar5 = pVVar5 + 1;
  }
LAB_0037093b:
  return (int)uVar3;
}

Assistant:

int Renderer::allocate_voice()
{
	int i, lowest;
	float lv, v;

	for (i = 0; i < voices; ++i)
	{
		if (!(voice[i].status & VOICE_RUNNING))
		{
			return i; /* Can't get a lower volume than silence */
		}
	}

	/* Look for the decaying note with the lowest volume */
	lowest = -1;
	lv = 1e10;
	i = voices;
	while (i--)
	{
		if ((voice[i].status & VOICE_RELEASING) && !(voice[i].status & VOICE_STOPPING))
		{
			v = voice[i].attenuation;
			if (v < lv)
			{
				lv = v;
				lowest = i;
			}
		}
	}

	if (lowest >= 0)
	{
		/* This can still cause a click, but if we had a free voice to
		   spare for ramping down this note, we wouldn't need to kill it
		   in the first place... Still, this needs to be fixed. Perhaps
		   we could use a reserve of voices to play dying notes only. */

		cut_notes++;
		voice[lowest].status = 0;
	}
	else
	{
		lost_notes++;
	}
	return lowest;
}